

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regset.c
# Opt level: O3

int make_regset(int line_no,int n,char **pat,OnigRegSet **rset,int error_no)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  undefined4 in_register_00000084;
  ulong uVar3;
  OnigRegSet *set;
  regex_t *reg;
  OnigErrorInfo einfo;
  char s [90];
  OnigRegSet *local_c8;
  OnigRegSet **local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [24];
  undefined1 local_98 [104];
  
  *rset = (OnigRegSet *)0x0;
  iVar1 = onig_regset_new(&local_c8,0,0,rset,CONCAT44(in_register_00000084,error_no));
  if (iVar1 == 0) {
    local_c0 = rset;
    if (0 < n) {
      uVar3 = 0;
      do {
        __s = pat[uVar3];
        sVar2 = strlen(__s);
        iVar1 = onig_new(&local_b8,__s,__s + sVar2,0,&OnigEncodingUTF8,_OnigDefaultSyntax,local_b0);
        if (iVar1 != 0) {
          onig_error_code_to_str(local_98,iVar1,local_b0);
          fprintf(_stderr,"ERROR: %d: %s  /%s/\n",(ulong)(uint)line_no,local_98,pat[uVar3]);
          nerror = nerror + 1;
          onig_regset_free(local_c8);
          return iVar1;
        }
        iVar1 = onig_regset_add(local_c8,local_b8);
        if (iVar1 != 0) {
          make_regset_cold_1();
          return iVar1;
        }
        uVar3 = uVar3 + 1;
      } while ((uint)n != uVar3);
    }
    *local_c0 = local_c8;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
make_regset(int line_no, int n, char* pat[], OnigRegSet** rset, int error_no)
{
  int r;
  int i;
  OnigRegSet* set;
  regex_t* reg;
  OnigErrorInfo einfo;

  *rset = NULL;
  r = onig_regset_new(&set, 0, NULL);
  if (r != 0) return r;

  for (i = 0; i < n; i++) {
    r = onig_new(&reg, (UChar* )pat[i], (UChar* )(pat[i] + strlen(pat[i])),
                 ONIG_OPTION_DEFAULT, ONIG_ENCODING_UTF8, ONIG_SYNTAX_DEFAULT,
                 &einfo);
    if (r != 0) {
      char s[ONIG_MAX_ERROR_MESSAGE_LEN];

      if (error_no == 0) {
        onig_error_code_to_str((UChar* )s, r, &einfo);
        fprintf(stderr, "ERROR: %d: %s  /%s/\n", line_no, s, pat[i]);
        nerror++;
      }
      else {
        if (r == error_no) {
          fprintf(stdout, "OK(ERROR): %d: /%s/ %d\n", line_no, pat[i], r);
          nsucc++;
        }
        else {
          fprintf(stdout, "FAIL(ERROR): %d: /%s/ %d, %d\n",
                  line_no, pat[i], error_no, r);
          nfail++;
        }
      }
      onig_regset_free(set);
      return r;
    }

    r = onig_regset_add(set, reg);
    if (r != 0) {
      onig_regset_free(set);
      fprintf(stderr, "ERROR: %d: onig_regset_add(): /%s/\n", line_no, pat[i]);
      nerror++;
      return r;
    }
  }

  *rset = set;
  return 0;
}